

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

void Assimp::FBX::anon_unknown_16::ReadBinaryDataArrayHead
               (char **data,char *end,char *type,uint32_t *count,Element *el)

{
  uint uVar1;
  uint32_t len;
  allocator<char> local_51;
  string local_50;
  Element *local_30;
  Element *el_local;
  uint32_t *count_local;
  char *type_local;
  char *end_local;
  char **data_local;
  
  local_30 = el;
  el_local = (Element *)count;
  count_local = (uint32_t *)type;
  type_local = end;
  end_local = (char *)data;
  if ((ulong)((long)end - (long)*data) < 5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,
               "binary data array is too short, need five (5) bytes for type signature and element count"
               ,&local_51);
    anon_unknown.dwarf_c19d72::ParseError(&local_50,local_30);
  }
  *type = **data;
  uVar1 = anon_unknown.dwarf_c19d72::SafeParse<unsigned_int>(*data + 1,end);
  *(uint *)&el_local->key_token = uVar1;
  *(long *)end_local = *(long *)end_local + 5;
  return;
}

Assistant:

void ReadBinaryDataArrayHead(const char*& data, const char* end, char& type, uint32_t& count,
    const Element& el)
{
    if (static_cast<size_t>(end-data) < 5) {
        ParseError("binary data array is too short, need five (5) bytes for type signature and element count",&el);
    }

    // data type
    type = *data;

    // read number of elements
    BE_NCONST uint32_t len = SafeParse<uint32_t>(data+1, end);
    AI_SWAP4(len);

    count = len;
    data += 5;
}